

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.hpp
# Opt level: O2

ostream * sciplot::internal::
          write<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<double,std::allocator<double>>>
                    (ostream *out,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *args,vector<double,_std::allocator<double>_> *args_1)

{
  size_t sVar1;
  size_t i;
  size_t i_00;
  
  sVar1 = minsize<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<double,std::allocator<double>>>
                    (args,args_1);
  for (i_00 = 0; sVar1 != i_00; i_00 = i_00 + 1) {
    writeline<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<double,std::allocator<double>>>
              (out,i_00,args,args_1);
  }
  return out;
}

Assistant:

auto write(std::ostream& out, const Args&... args) -> std::ostream&
{
    const auto size = minsize(args...);
    for (std::size_t i = 0; i < size; ++i)
        writeline(out, i, args...);
    return out;
}